

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall Js::ScriptContext::IsIntlEnabled(ScriptContext *this)

{
  bool bVar1;
  ScriptConfiguration *this_00;
  ScriptContext *this_local;
  
  this_00 = GetConfig(this);
  bVar1 = ScriptConfiguration::IsIntlEnabled(this_00);
  return bVar1;
}

Assistant:

bool ScriptContext::IsIntlEnabled()
    {
#ifdef ENABLE_INTL_OBJECT
        if (GetConfig()->IsIntlEnabled())
        {
#ifdef INTL_WINGLOB
            // This will try to load globalization dlls if not already loaded.
            Js::DelayLoadWindowsGlobalization* globLibrary = GetThreadContext()->GetWindowsGlobalizationLibrary();
            return globLibrary->HasGlobalizationDllLoaded();
#else
            return true;
#endif
        }
#endif
        return false;
    }